

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::TSPI_PDU::SetPositionError(TSPI_PDU *this,PositionError *PE)

{
  KUINT16 *pKVar1;
  DataTypeBase local_60;
  short local_58;
  KFIXED<short,_(unsigned_char)__b_> local_50;
  DataTypeBase local_40;
  short local_38;
  KFIXED<short,_(unsigned_char)__b_> local_30;
  
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 4) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 4;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 4;
  }
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00228398;
  local_38 = (PE->m_HorzErr).m_Val;
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_30,&(this->m_PosErr).m_HorzErr);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00228398;
  local_58 = (PE->m_VertErr).m_Val;
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_50,&(this->m_PosErr).m_VertErr);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_60);
  return;
}

Assistant:

void TSPI_PDU::SetPositionError( const PositionError & PE )
{
    SetPositionErrorFlag( true );
    m_PosErr = PE;
}